

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  bool bVar7;
  int tok;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  if (ptr == end) {
    return -1;
  }
  bVar1 = ptr[1];
  if (bVar1 < 0xdc) {
    if (bVar1 - 0xd8 < 4) {
LAB_004de6a8:
      if ((long)end - (long)ptr < 4) {
        return -2;
      }
      goto LAB_004de6c3;
    }
    if (bVar1 == 0) {
      bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      if (bVar2 < 0x16) {
        if (bVar2 == 5) {
          if ((long)end - (long)ptr < 2) {
            return -2;
          }
          goto LAB_004de6c3;
        }
        if (bVar2 == 6) {
          if ((long)end - (long)ptr < 3) {
            return -2;
          }
          goto LAB_004de6c3;
        }
        if (bVar2 != 7) goto LAB_004de6c3;
        goto LAB_004de6a8;
      }
      if ((bVar2 == 0x16) || (bVar2 == 0x18)) goto LAB_004de752;
      if (bVar2 != 0x1d) goto LAB_004de6c3;
    }
  }
  else if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < (byte)*ptr)))) goto LAB_004de6c3;
  if ((*(uint *)((long)namingBitmap +
                (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
       ((byte)*ptr & 0x1f) & 1) != 0) {
LAB_004de752:
    if (ptr + 2 == end) {
      return -1;
    }
    lVar4 = (long)end - (long)ptr;
    pbVar5 = (byte *)(ptr + 4);
LAB_004de782:
    lVar4 = lVar4 + -2;
    bVar1 = pbVar5[-1];
    if (0xdb < bVar1) {
      if (bVar1 == 0xff) {
        if (pbVar5[-2] < 0xfe) goto switchD_004de7b8_caseD_1d;
      }
      else if (3 < bVar1 - 0xdc) goto switchD_004de7b8_caseD_1d;
      goto switchD_004de7b8_caseD_8;
    }
    if (bVar1 != 0) {
      if (3 < bVar1 - 0xd8) goto switchD_004de7b8_caseD_1d;
switchD_004de7b8_caseD_7:
      if (lVar4 < 4) {
        return -2;
      }
      goto switchD_004de7b8_caseD_8;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)pbVar5[-2])) {
    case 5:
      if (lVar4 < 2) {
        return -2;
      }
      break;
    case 6:
      if (lVar4 < 3) {
        return -2;
      }
      break;
    case 7:
      goto switchD_004de7b8_caseD_7;
    case 9:
    case 10:
    case 0x15:
      iVar3 = little2_checkPiTarget
                        ((ENCODING *)ptr,(char *)(pbVar5 + -2),(char *)&local_34,
                         (int *)&switchD_004de7b8::switchdataD_005d3030);
      if (iVar3 == 0) {
        *nextTokPtr = (char *)(pbVar5 + -2);
        return 0;
      }
      if (pbVar5 == (byte *)end) {
        return -1;
      }
      goto LAB_004de89d;
    case 0xf:
      iVar3 = little2_checkPiTarget
                        ((ENCODING *)ptr,(char *)(pbVar5 + -2),(char *)&local_34,
                         (int *)&switchD_004de7b8::switchdataD_005d3030);
      if (iVar3 == 0) {
        *nextTokPtr = (char *)(pbVar5 + -2);
        return 0;
      }
      if (pbVar5 == (byte *)end) {
        return -1;
      }
      if ((pbVar5[1] != 0) || (*pbVar5 != 0x3e)) goto switchD_004de8fe_caseD_0;
      pbVar5 = pbVar5 + 2;
      goto LAB_004de9af;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_004de7b8_caseD_16;
    case 0x1d:
switchD_004de7b8_caseD_1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)(pbVar5[-2] >> 3 & 0x1c |
                           (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >> (pbVar5[-2] & 0x1f)
          & 1) != 0) goto switchD_004de7b8_caseD_16;
    }
switchD_004de7b8_caseD_8:
    pbVar5 = pbVar5 + -2;
    goto switchD_004de8fe_caseD_0;
  }
LAB_004de6c3:
  *nextTokPtr = ptr;
  return 0;
switchD_004de7b8_caseD_16:
  bVar7 = pbVar5 == (byte *)end;
  pbVar5 = pbVar5 + 2;
  if (bVar7) {
    return -1;
  }
  goto LAB_004de782;
LAB_004de89d:
  bVar1 = pbVar5[1];
  if (bVar1 < 0xdc) {
    if (bVar1 - 0xd8 < 4) {
switchD_004de8fe_caseD_7:
      if ((long)end - (long)pbVar5 < 4) {
        return -2;
      }
      pbVar6 = pbVar5 + 4;
      goto LAB_004de927;
    }
    if (bVar1 != 0) goto switchD_004de8fe_caseD_2;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar5)) {
    case 0:
    case 1:
    case 8:
      goto switchD_004de8fe_caseD_0;
    default:
      goto switchD_004de8fe_caseD_2;
    case 5:
      if ((long)end - (long)pbVar5 < 2) {
        return -2;
      }
      goto switchD_004de8fe_caseD_2;
    case 6:
      if ((long)end - (long)pbVar5 < 3) {
        return -2;
      }
      pbVar6 = pbVar5 + 3;
      break;
    case 7:
      goto switchD_004de8fe_caseD_7;
    case 0xf:
      pbVar6 = pbVar5 + 2;
      if (pbVar6 == (byte *)end) {
        return -1;
      }
      if ((pbVar5[3] == 0) && (*pbVar6 == 0x3e)) {
        pbVar5 = pbVar5 + 4;
LAB_004de9af:
        *nextTokPtr = (char *)pbVar5;
        return local_34;
      }
    }
  }
  else {
    if (bVar1 == 0xff) {
      if (*pbVar5 < 0xfe) goto switchD_004de8fe_caseD_2;
      goto switchD_004de8fe_caseD_0;
    }
    if (bVar1 - 0xdc < 4) {
switchD_004de8fe_caseD_0:
      *nextTokPtr = (char *)pbVar5;
      return 0;
    }
switchD_004de8fe_caseD_2:
    pbVar6 = pbVar5 + 2;
  }
LAB_004de927:
  pbVar5 = pbVar6;
  if (pbVar6 == (byte *)end) {
    return -1;
  }
  goto LAB_004de89d;
}

Assistant:

static
int PREFIX(scanPi)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr)
{
  int tok;
  const char *target = ptr;
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S: case BT_CR: case BT_LF:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (ptr != end) {
        switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}